

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SequenceFeatureType::MergePartialFromCodedStream
          (SequenceFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint32 uVar7;
  Int64FeatureType *this_00;
  ulong extraout_RAX;
  StringFeatureType *this_01;
  ulong extraout_RAX_00;
  SizeRange *this_02;
  ulong extraout_RAX_01;
  char cVar8;
  ulong uVar9;
  int local_3c;
  int local_38;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_001d7c2f;
        uVar9 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_001d7c2f:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar9 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar7 | uVar9;
    }
    uVar7 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto LAB_001d7aa6;
    uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar6 == 0x65) {
      if (cVar8 != '*') goto LAB_001d7aa6;
      if (this->sizerange_ == (SizeRange *)0x0) {
        this_02 = (SizeRange *)operator_new(0x28);
        SizeRange::SizeRange(this_02);
        this->sizerange_ = this_02;
      }
      MergePartialFromCodedStream();
      iVar5 = local_3c;
      uVar9 = extraout_RAX_01;
joined_r0x001d7c20:
      if ((uVar9 & 1) != 0) goto LAB_001d7ad1;
LAB_001d7acf:
      iVar5 = 0;
    }
    else if (uVar6 == 3) {
      if (cVar8 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_Type(this);
          this->_oneof_case_[0] = 3;
          this_01 = (StringFeatureType *)operator_new(0x18);
          StringFeatureType::StringFeatureType(this_01);
          (this->Type_).stringtype_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar5 = local_38;
        uVar9 = extraout_RAX_00;
        goto joined_r0x001d7c20;
      }
LAB_001d7aa6:
      iVar5 = 7;
      if ((uVar7 & 7) != 4 && uVar7 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
        if (bVar4) goto LAB_001d7acf;
        iVar5 = 6;
      }
    }
    else {
      if ((uVar6 != 1) || (cVar8 != '\n')) goto LAB_001d7aa6;
      if (this->_oneof_case_[0] != 1) {
        clear_Type(this);
        this->_oneof_case_[0] = 1;
        this_00 = (Int64FeatureType *)operator_new(0x18);
        Int64FeatureType::Int64FeatureType(this_00);
        (this->Type_).int64type_ = this_00;
      }
      MergePartialFromCodedStream();
      iVar5 = local_34;
      if ((extraout_RAX & 1) == 0) goto LAB_001d7acf;
    }
LAB_001d7ad1:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool SequenceFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SequenceFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64Type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringType = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SizeRange sizeRange = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sizerange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SequenceFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SequenceFeatureType)
  return false;
#undef DO_
}